

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

bool compress_streaming(ilzham *lzham_dll,char *pSrc_filename,char *pDst_filename,
                       comp_options *options)

{
  uint uVar1;
  timer_ticks tVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  undefined4 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint64 cmp_file_size;
  double total_time;
  timer_ticks end_time;
  uint32 adler32;
  int i_2;
  size_t out_num_bytes;
  uint8 *pOut_bytes;
  size_t num_in_bytes;
  uint8 *pIn_bytes;
  int i_1;
  double comp_rate;
  double total_bytes_processed;
  double total_elapsed_time;
  lzham_compress_status_t status;
  timer_ticks total_init_time;
  lzham_compress_state_ptr pComp_state;
  timer_ticks init_start_time;
  lzham_compress_params params;
  timer_ticks start_time;
  uint64 total_output_bytes;
  uint in_file_buf_ofs;
  uint in_file_buf_size;
  uint64 src_bytes_left;
  uint8 *out_file_buf;
  uint8 *in_file_buf;
  uint cOutBufSize;
  uint cInBufSize;
  uint i;
  uint64 src_file_size;
  FILE *pOutFile;
  FILE *pInFile;
  float local_178;
  float local_16c;
  float local_164;
  ulong local_148;
  float local_134;
  float local_12c;
  double local_128;
  int local_104;
  ulong local_100;
  void *local_f8;
  ulong local_f0;
  long local_e8;
  int local_dc;
  double local_d8;
  double local_d0;
  double local_c8;
  uint local_bc;
  long local_b8;
  long local_b0;
  timer_ticks local_a8;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  uint local_84;
  timer_ticks local_80;
  long local_78;
  uint local_70;
  uint local_6c;
  ulong local_68;
  void *local_60;
  void *local_58;
  undefined4 local_4c;
  undefined4 local_48;
  uint local_44;
  ulong local_40;
  FILE *local_38;
  FILE *local_30;
  undefined4 *local_28;
  char *local_20;
  char *local_18;
  long local_10;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  printf("Testing: Streaming compression\n");
  local_30 = fopen64(local_18,"rb");
  if (local_30 == (FILE *)0x0) {
    print_error("Unable to read file: %s\n",local_18);
    local_1 = false;
  }
  else {
    local_38 = fopen64(local_20,"wb");
    if (local_38 == (FILE *)0x0) {
      print_error("Unable to create file: %s\n",local_20);
      local_1 = false;
    }
    else {
      fseeko64(local_30,0,2);
      local_40 = ftello64(local_30);
      fseeko64(local_30,0,0);
      fputc(0x4c,local_38);
      fputc(0x5a,local_38);
      fputc(0x48,local_38);
      fputc(0x30,local_38);
      fputc(local_28[1],local_38);
      for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
        fputc((uint)(local_40 >> ((byte)(local_44 << 3) & 0x3f)) & 0xff,local_38);
      }
      local_48 = 0x40000;
      local_4c = 0x40000;
      local_58 = (void *)memalign(0x10,0x40000);
      local_60 = (void *)memalign(0x10);
      if ((local_58 == (void *)0x0) || (local_60 == (void *)0x0)) {
        print_error("Out of memory!\n");
        free(local_58);
        free(local_60);
        fclose(local_30);
        fclose(local_38);
        local_1 = false;
      }
      else {
        local_68 = local_40;
        local_6c = 0;
        local_70 = 0;
        local_78 = 0;
        local_80 = timer::get_ticks();
        memset(&local_9c,0,0x1c);
        local_9c = 0x1c;
        local_98 = local_28[1];
        local_90 = local_28[3];
        local_94 = *local_28;
        if ((*(byte *)((long)local_28 + 0x12) & 1) != 0) {
          local_84 = local_84 | 1;
        }
        if ((*(byte *)(local_28 + 5) & 1) != 0) {
          local_84 = local_84 | 2;
        }
        if ((*(byte *)((long)local_28 + 0x15) & 1) != 0) {
          local_84 = local_84 | 4;
        }
        local_88 = 0;
        local_8c = 0;
        local_a8 = timer::get_ticks();
        local_b0 = (**(code **)(local_10 + 0x18))(&local_9c);
        tVar2 = timer::get_ticks();
        local_b8 = tVar2 - local_a8;
        if (local_b0 == 0) {
          print_error("Failed initializing compressor!\n");
          free(local_58);
          free(local_60);
          fclose(local_30);
          fclose(local_38);
          local_1 = false;
        }
        else {
          dVar6 = timer::ticks_to_secs(0x111a5e);
          printf("lzham_compress_init took %3.3fms\n",dVar6 * 1000.0);
          do {
            if (local_40 != 0) {
              timer::get_ticks();
              local_c8 = timer::ticks_to_secs(0x111a9f);
              lVar3 = local_40 - local_68;
              auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar7._0_8_ = lVar3;
              auVar7._12_4_ = 0x45300000;
              local_d0 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
              if (local_c8 <= 0.0) {
                local_128 = 0.0;
              }
              else {
                local_128 = local_d0 / local_c8;
              }
              local_d8 = local_128;
              for (local_dc = 0; local_dc < 0xf; local_dc = local_dc + 1) {
                printf("\b\b\b\b");
              }
              local_12c = (float)local_68;
              local_134 = (float)local_40;
              printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec",
                     (double)((1.0 - local_12c / local_134) * 100.0),(double)(local_12c / 1048576.0)
                     ,local_d8 / 1048576.0);
              printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
            }
            if (local_70 == local_6c) {
              if (local_68 < 0x40001) {
                local_148 = local_68;
              }
              else {
                local_148 = 0x40000;
              }
              local_6c = (uint)local_148;
              sVar4 = fread(local_58,1,local_148 & 0xffffffff,local_30);
              if (sVar4 != local_6c) {
                printf("\n");
                print_error("Failure reading from source file!\n");
                free(local_58);
                free(local_60);
                fclose(local_30);
                fclose(local_38);
                (**(code **)(local_10 + 0x40))(local_b0);
                return false;
              }
              local_68 = local_68 - local_6c;
              local_70 = 0;
            }
            local_e8 = (long)local_58 + (ulong)local_70;
            local_f0 = (ulong)(local_6c - local_70);
            local_f8 = local_60;
            local_100 = 0x40000;
            local_bc = (**(code **)(local_10 + 0x28))
                                 (local_b0,local_e8,&local_f0,local_60,&local_100,local_68 == 0);
            if (local_f0 != 0) {
              local_70 = (int)local_f0 + local_70;
            }
            if (local_100 != 0) {
              sVar4 = fwrite(local_60,1,local_100 & 0xffffffff,local_38);
              if (sVar4 != local_100) {
                printf("\n");
                print_error("Failure writing to destination file!\n");
                free(local_58);
                free(local_60);
                fclose(local_30);
                fclose(local_38);
                (**(code **)(local_10 + 0x40))(local_b0);
                return false;
              }
              local_78 = local_100 + local_78;
            }
          } while ((local_bc == 0) || (local_bc == 1));
          for (local_104 = 0; local_104 < 0xf; local_104 = local_104 + 1) {
            printf("\b\b\b\b    \b\b\b\b");
          }
          local_68 = (local_6c - local_70) + local_68;
          uVar1 = (**(code **)(local_10 + 0x20))(local_b0);
          local_b0 = 0;
          timer::get_ticks();
          dVar6 = timer::ticks_to_secs(0x111fc1);
          uVar5 = ftello64(local_38);
          free(local_58);
          local_58 = (void *)0x0;
          free(local_60);
          local_60 = (void *)0x0;
          fclose(local_30);
          local_30 = (FILE *)0x0;
          fclose(local_38);
          local_38 = (FILE *)0x0;
          if (local_bc == 2) {
            if (local_68 == 0) {
              printf("Success\n");
              if (local_40 == 0) {
                local_178 = 0.0;
              }
              else {
                local_164 = (float)uVar5;
                local_16c = (float)local_40;
                local_178 = (1.0 - local_164 / local_16c) * 100.0;
              }
              printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",
                     (double)local_178,local_40,uVar5);
              auVar8._8_4_ = (int)(local_40 >> 0x20);
              auVar8._0_8_ = local_40;
              auVar8._12_4_ = 0x45300000;
              auVar9._8_4_ = (int)(uVar5 >> 0x20);
              auVar9._0_8_ = uVar5;
              auVar9._12_4_ = 0x45300000;
              printf("Compression time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                     ,dVar6,((auVar8._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0)) /
                            dVar6,
                     ((auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) / dVar6);
              printf("Input file adler32: 0x%08X\n",(ulong)uVar1);
              local_1 = true;
            }
            else {
              print_error("Compressor failed to consume entire input file!\n");
              local_1 = false;
            }
          }
          else {
            print_error("Compression failed with status %i\n",(ulong)local_bc);
            local_1 = false;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

static bool compress_streaming(ilzham &lzham_dll, const char* pSrc_filename, const char *pDst_filename, const comp_options &options)
{
   printf("Testing: Streaming compression\n");

   FILE *pInFile = fopen(pSrc_filename, "rb");
   if (!pInFile)
   {
      print_error("Unable to read file: %s\n", pSrc_filename);
      return false;
   }

   FILE *pOutFile = fopen(pDst_filename, "wb");
   if (!pOutFile)
   {
      print_error("Unable to create file: %s\n", pDst_filename);
      return false;
   }

   _fseeki64(pInFile, 0, SEEK_END);
   uint64 src_file_size = _ftelli64(pInFile);
   _fseeki64(pInFile, 0, SEEK_SET);

   fputc('L', pOutFile);
   fputc('Z', pOutFile);
   fputc('H', pOutFile);
   fputc('0', pOutFile);
   fputc(options.m_dict_size_log2, pOutFile);

   for (uint i = 0; i < 8; i++)
   {
      fputc(static_cast<int>((src_file_size >> (i * 8)) & 0xFF), pOutFile);
   }

   const uint cInBufSize = LZHAMTEST_COMP_INPUT_BUFFER_SIZE;
   const uint cOutBufSize = LZHAMTEST_COMP_OUTPUT_BUFFER_SIZE;

   uint8 *in_file_buf = static_cast<uint8*>(_aligned_malloc(cInBufSize, 16));
   uint8 *out_file_buf = static_cast<uint8*>(_aligned_malloc(cOutBufSize, 16));
   if ((!in_file_buf) || (!out_file_buf))
   {
      print_error("Out of memory!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   uint64 src_bytes_left = src_file_size;

   uint in_file_buf_size = 0;
   uint in_file_buf_ofs = 0;

   uint64 total_output_bytes = 0;

   timer_ticks start_time = timer::get_ticks();

   lzham_compress_params params;
   memset(&params, 0, sizeof(params));
   params.m_struct_size = sizeof(lzham_compress_params);
   params.m_dict_size_log2 = options.m_dict_size_log2;
   params.m_max_helper_threads = options.m_max_helper_threads;
   params.m_level = options.m_comp_level;
   if (options.m_force_polar_codes)
   {
      params.m_compress_flags |= LZHAM_COMP_FLAG_FORCE_POLAR_CODING;
   }
   if (options.m_extreme_parsing)
   {
      params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;
   }
   if (options.m_deterministic_parsing)
   {
      params.m_compress_flags |= LZHAM_COMP_FLAG_DETERMINISTIC_PARSING;
   }
   params.m_cpucache_line_size = 0;
   params.m_cpucache_total_lines = 0;

   timer_ticks init_start_time = timer::get_ticks();
   lzham_compress_state_ptr pComp_state = lzham_dll.lzham_compress_init(&params);
   timer_ticks total_init_time = timer::get_ticks() - init_start_time;

   if (!pComp_state)
   {
      print_error("Failed initializing compressor!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   printf("lzham_compress_init took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

   lzham_compress_status_t status;
   for ( ; ; )
   {
      if (src_file_size)
      {
         double total_elapsed_time = timer::ticks_to_secs(timer::get_ticks() - start_time);
         double total_bytes_processed = static_cast<double>(src_file_size - src_bytes_left);
         double comp_rate = (total_elapsed_time > 0.0f) ? total_bytes_processed / total_elapsed_time : 0.0f;

         for (int i = 0; i < 15; i++)
            printf("\b\b\b\b");
         printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec", (1.0f - (static_cast<float>(src_bytes_left) / src_file_size)) * 100.0f, src_bytes_left / 1048576.0f, comp_rate / (1024.0f * 1024.0f));
         printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
      }

      if (in_file_buf_ofs == in_file_buf_size)
      {
         in_file_buf_size = static_cast<uint>(my_min(cInBufSize, src_bytes_left));

         if (fread(in_file_buf, 1, in_file_buf_size, pInFile) != in_file_buf_size)
         {
            printf("\n");
            print_error("Failure reading from source file!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            lzham_dll.lzham_decompress_deinit(pComp_state);
            return false;
         }

         src_bytes_left -= in_file_buf_size;

         in_file_buf_ofs = 0;
      }

      uint8 *pIn_bytes = &in_file_buf[in_file_buf_ofs];
      size_t num_in_bytes = in_file_buf_size - in_file_buf_ofs;
      uint8* pOut_bytes = out_file_buf;
      size_t out_num_bytes = cOutBufSize;

      status = lzham_dll.lzham_compress(pComp_state, pIn_bytes, &num_in_bytes, pOut_bytes, &out_num_bytes, src_bytes_left == 0);

      if (num_in_bytes)
      {
         in_file_buf_ofs += (uint)num_in_bytes;
         assert(in_file_buf_ofs <= in_file_buf_size);
      }

      if (out_num_bytes)
      {
         if (fwrite(out_file_buf, 1, static_cast<uint>(out_num_bytes), pOutFile) != out_num_bytes)
         {
            printf("\n");
            print_error("Failure writing to destination file!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            lzham_dll.lzham_decompress_deinit(pComp_state);
            return false;
         }

         total_output_bytes += out_num_bytes;
      }

      if ((status != LZHAM_COMP_STATUS_NOT_FINISHED) && (status != LZHAM_COMP_STATUS_NEEDS_MORE_INPUT))
         break;
   }

   for (int i = 0; i < 15; i++)
   {
      printf("\b\b\b\b    \b\b\b\b");
   }

   src_bytes_left += (in_file_buf_size - in_file_buf_ofs);

   uint32 adler32 = lzham_dll.lzham_compress_deinit(pComp_state);
   pComp_state = NULL;

   timer_ticks end_time = timer::get_ticks();
   double total_time = timer::ticks_to_secs(my_max(1, end_time - start_time));

   uint64 cmp_file_size = _ftelli64(pOutFile);

   _aligned_free(in_file_buf);
   in_file_buf = NULL;
   _aligned_free(out_file_buf);
   out_file_buf = NULL;

   fclose(pInFile);
   pInFile = NULL;
   fclose(pOutFile);
   pOutFile = NULL;

   if (status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression failed with status %i\n", status);
      return false;
   }

   if (src_bytes_left)
   {
      print_error("Compressor failed to consume entire input file!\n");
      return false;
   }

   printf("Success\n");
   printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);
   printf("Compression time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_time, src_file_size / total_time, cmp_file_size / total_time);
   printf("Input file adler32: 0x%08X\n", adler32);

   return true;
}